

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Args.cpp
# Opt level: O2

int __thiscall cali::util::Args::ArgsImpl::parse(ArgsImpl *this,int argc,char **argv,int pos)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *this_00;
  map<char,_unsigned_long,_std::less<char>,_std::allocator<std::pair<const_char,_unsigned_long>_>_>
  *this_01;
  string *__rhs;
  string *psVar1;
  map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_02;
  string *psVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_03;
  int iVar3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *pmVar4;
  map<char,_unsigned_long,_std::less<char>,_std::allocator<std::pair<const_char,_unsigned_long>_>_>
  *pmVar5;
  __type _Var6;
  long lVar7;
  iterator iVar8;
  ulong uVar9;
  iterator iVar10;
  char **__args;
  size_type n;
  ulong uVar11;
  char cVar12;
  bool bVar13;
  allocator<char> local_f9;
  ArgsImpl *local_f8;
  char **local_f0;
  string optarg;
  string arg;
  undefined1 local_58 [40];
  
  if (pos < argc) {
    std::__cxx11::string::assign((char *)&this->m_programname);
    __rhs = &this->m_options_end;
    psVar1 = &this->m_longopt_prefix;
    this_00 = &this->m_long_options;
    pmVar4 = &this->m_long_options;
    this_02 = &this->m_active_options;
    psVar2 = &this->m_shortopt_prefix;
    this_01 = &this->m_short_options;
    pmVar5 = &this->m_short_options;
    this_03 = &this->m_arguments;
    local_f8 = this;
    local_f0 = argv;
    for (; pos < argc; pos = pos + 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&arg,argv[pos],(allocator<char> *)local_58);
      if (arg._M_string_length != 0) {
        _Var6 = std::operator==(&arg,__rhs);
        if (_Var6) {
          std::__cxx11::string::~string((string *)&arg);
          break;
        }
        cVar12 = (char)&arg;
        if (((this->m_longopt_prefix)._M_string_length == 0) ||
           (lVar7 = std::__cxx11::string::find((string *)&arg,(ulong)psVar1), lVar7 != 0)) {
          uVar11 = (this->m_shortopt_prefix)._M_string_length;
          if ((uVar11 == 0) ||
             (lVar7 = std::__cxx11::string::find((string *)&arg,(ulong)psVar2), lVar7 != 0)) {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_03,
                       &arg);
            this = local_f8;
          }
          else {
            uVar9 = std::__cxx11::string::find(cVar12,0x3d);
            for (; (argv = local_f0, this = local_f8, uVar11 < uVar9 &&
                   (uVar11 < arg._M_string_length)); uVar11 = uVar11 + 1) {
              iVar10 = std::
                       _Rb_tree<char,_std::pair<const_char,_unsigned_long>,_std::_Select1st<std::pair<const_char,_unsigned_long>_>,_std::less<char>,_std::allocator<std::pair<const_char,_unsigned_long>_>_>
                       ::find(&this_01->_M_t,arg._M_dataplus._M_p + uVar11);
              if ((_Rb_tree_header *)iVar10._M_node == &(pmVar5->_M_t)._M_impl.super__Rb_tree_header
                 ) goto LAB_00112ab3;
              optarg._M_dataplus._M_p = (pointer)&optarg.field_2;
              optarg._M_string_length = 0;
              optarg.field_2._M_local_buf[0] = '\0';
              if (uVar9 - 1 == uVar11 && uVar9 + 1 < arg._M_string_length) {
                std::__cxx11::string::assign((string *)&optarg,(ulong)&arg,uVar9 + 1);
              }
              if (((uVar11 == arg._M_string_length - 1) &&
                  ((local_f8->m_options).
                   super__Vector_base<cali::util::Args::Table,_std::allocator<cali::util::Args::Table>_>
                   ._M_impl.super__Vector_impl_data._M_start[(long)iVar10._M_node[1]._M_parent].
                   has_argument == true)) && (iVar3 = pos + 1, iVar3 < argc)) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)local_58,local_f0[iVar3],&local_f9);
                std::__cxx11::string::operator=((string *)&optarg,(string *)local_58);
                std::__cxx11::string::~string((string *)local_58);
                pos = iVar3;
              }
              std::
              pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::
              pair<unsigned_long_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                        ((pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_58,(unsigned_long *)&iVar10._M_node[1]._M_parent,&optarg);
              std::
              _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::string>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<unsigned_long,std::__cxx11::string>>
                        ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::string>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>>
                          *)this_02,
                         (pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_58);
              std::__cxx11::string::~string((string *)(local_58 + 8));
              std::__cxx11::string::~string((string *)&optarg);
            }
          }
        }
        else {
          lVar7 = std::__cxx11::string::find(cVar12,0x3d);
          std::__cxx11::string::substr((ulong)local_58,(ulong)&arg);
          iVar8 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                  ::find(&this_00->_M_t,(key_type *)local_58);
          std::__cxx11::string::~string((string *)local_58);
          argv = local_f0;
          if ((_Rb_tree_header *)iVar8._M_node == &(pmVar4->_M_t)._M_impl.super__Rb_tree_header) {
LAB_00112ab3:
            std::__cxx11::string::~string((string *)&arg);
            return pos;
          }
          optarg._M_string_length = 0;
          optarg._M_dataplus._M_p = (pointer)&optarg.field_2;
          optarg.field_2._M_local_buf[0] = '\0';
          bVar13 = true;
          if ((lVar7 != -1) && (lVar7 + 1U < arg._M_string_length)) {
            std::__cxx11::string::assign((string *)&optarg,(ulong)&arg,lVar7 + 1U);
            bVar13 = optarg._M_string_length == 0;
            this = local_f8;
          }
          if ((((this->m_options).
                super__Vector_base<cali::util::Args::Table,_std::allocator<cali::util::Args::Table>_>
                ._M_impl.super__Vector_impl_data._M_start[*(long *)(iVar8._M_node + 2)].has_argument
                == true) && (bVar13)) && (pos + 1 < argc)) {
            std::__cxx11::string::assign((char *)&optarg);
            pos = pos + 1;
          }
          std::
          pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<unsigned_long_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                    ((pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_58,(unsigned_long *)(iVar8._M_node + 2),&optarg);
          std::
          _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::string>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<unsigned_long,std::__cxx11::string>>
                    ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::string>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>>
                      *)this_02,
                     (pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_58);
          std::__cxx11::string::~string((string *)(local_58 + 8));
          std::__cxx11::string::~string((string *)&optarg);
          this = local_f8;
        }
      }
      std::__cxx11::string::~string((string *)&arg);
    }
    lVar7 = (long)pos;
    __args = argv + lVar7 + 1;
    while (lVar7 = lVar7 + 1, lVar7 < argc) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*const&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_03,__args
                );
      __args = __args + 1;
    }
    pos = (int)lVar7;
  }
  return pos;
}

Assistant:

int parse(int argc, const char* const argv[], int pos)
    {
        if (argc <= pos)
            return pos;

        m_programname = argv[0];

        int i;

        for (i = pos; i < argc; ++i) {
            std::string arg { argv[i] };

            if (arg.empty())
                continue;
            if (arg == m_options_end)
                break;

            // --- handle long options

            auto lps = m_longopt_prefix.size();

            if (!m_longopt_prefix.empty() && arg.find(m_longopt_prefix) == 0) {
                std::string::size_type dpos = arg.find('=');

                auto it = m_long_options.find(arg.substr(lps, dpos == std::string::npos ? dpos : dpos - lps));

                if (it == m_long_options.end())
                    return i;

                std::string optarg;

                if (dpos != std::string::npos && dpos + 1 < arg.size())
                    optarg.assign(arg, dpos + 1, std::string::npos);
                if (m_options[it->second].has_argument && optarg.empty() && i + 1 < argc)
                    optarg.assign(argv[++i]);

                m_active_options.insert(make_pair(it->second, optarg));

                continue;
            }

            // handle short options

            auto sps = m_shortopt_prefix.size();

            if (!m_shortopt_prefix.empty() && arg.find(m_shortopt_prefix) == 0) {
                std::string::size_type dpos = arg.find('=');

                // handle characters in the shortopt string; last one may have an option argument
                for (auto n = sps; n < arg.size() && n < dpos; ++n) {
                    auto it = m_short_options.find(arg[n]);

                    if (it == m_short_options.end())
                        return i;

                    std::string optarg;

                    if (dpos + 1 < arg.size() && n == dpos - 1)
                        optarg.assign(arg, dpos + 1, std::string::npos);
                    if (n == arg.size() - 1 && m_options[it->second].has_argument && (i + 1) < argc)
                        optarg.assign(std::string(argv[++i]));

                    m_active_options.insert(make_pair(it->second, optarg));
                }

                continue;
            }

            // this is a non-option argument
            m_arguments.emplace_back(arg);
        }

        // treat all remaining elements as arguments (i.e., not options)

        for (++i; i < argc; ++i)
            m_arguments.emplace_back(argv[i]);

        return i;
    }